

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

Expression *
slang::ast::MinTypMaxExpression::fromSyntax
          (Compilation *compilation,MinTypMaxExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  MinTypMax MVar1;
  Type *args;
  Expression *args_1;
  bool bVar2;
  ulong uVar3;
  Expression *args_2;
  Expression *args_3;
  MinTypMaxExpression *expr;
  bitmask<slang::ast::ASTFlags> extraFlags;
  bitmask<slang::ast::ASTFlags> extraFlags_00;
  bitmask<slang::ast::ASTFlags> extraFlags_01;
  Expression *selected;
  Expression *local_50;
  Expression *local_48;
  SourceRange local_40;
  
  uVar3 = (ulong)(compilation->options).minTypMax;
  extraFlags_01.m_bits = 2;
  extraFlags_00.m_bits = 2;
  extraFlags.m_bits = 2;
  if (uVar3 < 3) {
    extraFlags_01.m_bits = *(underlying_type *)(&DAT_004edfd8 + uVar3 * 8);
    extraFlags_00.m_bits = *(underlying_type *)(&DAT_004edff0 + uVar3 * 8);
    extraFlags.m_bits = *(underlying_type *)(&DAT_004ee008 + uVar3 * 8);
  }
  local_48 = Expression::create(compilation,(syntax->min).ptr,context,extraFlags,assignmentTarget);
  args_2 = Expression::create(compilation,(syntax->typ).ptr,context,extraFlags_00,assignmentTarget);
  args_3 = Expression::create(compilation,(syntax->max).ptr,context,extraFlags_01,assignmentTarget);
  args_1 = local_48;
  MVar1 = (compilation->options).minTypMax;
  local_50 = args_3;
  if ((MVar1 != Max) && (local_50 = args_2, MVar1 != Typ)) {
    local_50 = local_48;
  }
  args = (local_50->type).ptr;
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::MinTypMaxExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression*&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,args,args_1,args_2,args_3,&local_50,&local_40)
  ;
  bVar2 = Expression::bad(args_1);
  if (((bVar2) || (bVar2 = Expression::bad(args_2), bVar2)) ||
     (bVar2 = Expression::bad(args_3), bVar2)) {
    expr = (MinTypMaxExpression *)Expression::badExpr(compilation,&expr->super_Expression);
  }
  return &expr->super_Expression;
}

Assistant:

Expression& MinTypMaxExpression::fromSyntax(Compilation& compilation,
                                            const MinTypMaxExpressionSyntax& syntax,
                                            const ASTContext& context,
                                            const Type* assignmentTarget) {
    // Only one of the expressions will be considered evaluated.
    auto minFlags = ASTFlags::UnevaluatedBranch;
    auto typFlags = ASTFlags::UnevaluatedBranch;
    auto maxFlags = ASTFlags::UnevaluatedBranch;
    switch (compilation.getOptions().minTypMax) {
        case MinTypMax::Min:
            minFlags = ASTFlags::None;
            break;
        case MinTypMax::Typ:
            typFlags = ASTFlags::None;
            break;
        case MinTypMax::Max:
            maxFlags = ASTFlags::None;
            break;
    }

    auto& min = create(compilation, *syntax.min, context, minFlags, assignmentTarget);
    auto& typ = create(compilation, *syntax.typ, context, typFlags, assignmentTarget);
    auto& max = create(compilation, *syntax.max, context, maxFlags, assignmentTarget);

    Expression* selected = nullptr;
    switch (compilation.getOptions().minTypMax) {
        case MinTypMax::Min:
            selected = &min;
            break;
        case MinTypMax::Typ:
            selected = &typ;
            break;
        case MinTypMax::Max:
            selected = &max;
            break;
    }

    auto result = compilation.emplace<MinTypMaxExpression>(*selected->type, min, typ, max, selected,
                                                           syntax.sourceRange());
    if (min.bad() || typ.bad() || max.bad())
        return badExpr(compilation, result);

    return *result;
}